

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::stack_type<cs::domain_type,_std::allocator>::push<>
          (stack_type<cs::domain_type,_std::allocator> *this)

{
  bool bVar1;
  string *str;
  stack_type<cs::domain_type,_std::allocator> *in_RDI;
  error *this_00;
  domain_type *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  bVar1 = full(in_RDI);
  if (!bVar1) {
    in_RDI->m_current = in_RDI->m_current + 1;
    domain_type::domain_type(in_stack_ffffffffffffffd0);
    return;
  }
  str = (string *)__cxa_allocate_exception(0x28);
  this_00 = (error *)&stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"E000I",(allocator *)this_00);
  cov::error::error(this_00,str);
  __cxa_throw(str,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void push(ArgsT &&...args)
		{
			if (full())
				throw cov::error("E000I");
			::new(m_current++) T(std::forward<ArgsT>(args)...);
		}